

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::OneHotLayerParams::MergeFrom(OneHotLayerParams *this,OneHotLayerParams *from)

{
  float fVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x117fe);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from->onehotvectorsize_ != 0) {
    this->onehotvectorsize_ = from->onehotvectorsize_;
  }
  if (from->axis_ != 0) {
    this->axis_ = from->axis_;
  }
  fVar1 = from->onvalue_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->onvalue_ = fVar1;
  }
  fVar1 = from->offvalue_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->offvalue_ = fVar1;
  }
  return;
}

Assistant:

void OneHotLayerParams::MergeFrom(const OneHotLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.OneHotLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.onehotvectorsize() != 0) {
    set_onehotvectorsize(from.onehotvectorsize());
  }
  if (from.axis() != 0) {
    set_axis(from.axis());
  }
  if (from.onvalue() != 0) {
    set_onvalue(from.onvalue());
  }
  if (from.offvalue() != 0) {
    set_offvalue(from.offvalue());
  }
}